

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O1

uint8_t * __thiscall VC1StreamReader::findNextFrame(VC1StreamReader *this,uint8_t *buffer)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  
  pbVar2 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  for (pbVar4 = buffer + 2; pbVar6 = pbVar2, pbVar4 < pbVar2; pbVar4 = pbVar4 + lVar3) {
    lVar3 = 3;
    if (*pbVar4 < 2) {
      if (*pbVar4 == 0) {
        lVar3 = 1;
      }
      else if ((pbVar4[-2] == 0) && (pbVar4[-1] == 0)) {
        pbVar6 = pbVar4 + -2;
        break;
      }
    }
  }
  bVar7 = pbVar6 < pbVar2 + -4;
  pbVar4 = pbVar6;
  if (bVar7) {
    bVar1 = pbVar6[3];
    pbVar5 = pbVar6;
    while (pbVar4 = pbVar5, (bVar1 & 0xef) == 0xc) {
      for (pbVar4 = pbVar5 + 6; pbVar5 = pbVar2, pbVar4 < pbVar2; pbVar4 = pbVar4 + lVar3) {
        lVar3 = 3;
        if (*pbVar4 < 2) {
          if (*pbVar4 == 0) {
            lVar3 = 1;
          }
          else if ((pbVar4[-2] == 0) && (pbVar4[-1] == 0)) {
            pbVar5 = pbVar4 + -2;
            break;
          }
        }
      }
      bVar7 = pbVar5 < pbVar2 + -4;
      pbVar4 = pbVar6;
      if (!bVar7) break;
      bVar1 = pbVar5[3];
    }
  }
  pbVar6 = (byte *)0x0;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    pbVar6 = pbVar2;
  }
  if (bVar7) {
    pbVar6 = pbVar4;
  }
  return pbVar6;
}

Assistant:

uint8_t* VC1StreamReader::findNextFrame(uint8_t* buffer) const
{
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code != VC1Code::FIELD && vc1Code != VC1Code::USER_FIELD)
            return nal;
    }
    if (m_eof)
        return m_bufEnd;
    return nullptr;
}